

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

size_t __thiscall
absl::lts_20250127::container_internal::CommonFields::alloc_size
          (CommonFields *this,size_t slot_size,size_t slot_align)

{
  size_t sVar1;
  RawHashSetLayout local_30;
  
  RawHashSetLayout::RawHashSetLayout
            (&local_30,this->capacity_,slot_align,(bool)((byte)(int)this->size_ & 1));
  sVar1 = RawHashSetLayout::alloc_size(&local_30,slot_size);
  return sVar1;
}

Assistant:

size_t alloc_size(size_t slot_size, size_t slot_align) const {
    return RawHashSetLayout(capacity(), slot_align, has_infoz())
        .alloc_size(slot_size);
  }